

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O3

void __thiscall CGL::Application::resize(Application *this,size_t w,size_t h)

{
  this->screenW = w;
  this->screenH = h;
  CGL::Camera::set_screen_size((ulong)&this->camera,w);
  if (this->gl_window == true) {
    OSDText::resize(&this->textManager,w,h);
    set_projection_matrix(this);
  }
  if (this->mode != EDIT_MODE) {
    (*this->renderer->_vptr_OfflineRenderer[4])(this->renderer,w,h);
    return;
  }
  return;
}

Assistant:

void Application::resize(size_t w, size_t h) {
  screenW = w;
  screenH = h;
  camera.set_screen_size(w, h);
  if (gl_window) {
    textManager.resize(w, h);
    set_projection_matrix();
  }

  if (mode != EDIT_MODE) {
    renderer->set_frame_size(w, h);
  }
}